

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::Y_formatter::format
          (Y_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  scoped_pad p;
  
  scoped_pad::scoped_pad(&p,4,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::append_int<int,500ul>(tm_time->tm_year + 0x76c,dest);
  scoped_pad::~scoped_pad(&p);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 4;
        scoped_pad p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }